

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O3

void duckdb::LambdaFunctions::ListReduceFunction
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  byte bVar1;
  undefined8 uVar2;
  _Head_base<0UL,_duckdb::Vector_*,_false> __ptr;
  element_type *peVar3;
  ClientContext *context;
  Allocator *pAVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  pointer pVVar6;
  type pVVar7;
  reference pvVar8;
  reference pvVar9;
  Vector *pVVar10;
  pointer this;
  tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> this_00;
  DataChunk *pDVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t idx_in_entry;
  ulong index;
  size_type __n;
  ulong uVar14;
  long lVar15;
  idx_t index_00;
  bool bVar16;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  idx_t reduced_row_idx;
  bool completed;
  SelectionVector right_sel;
  Vector index_vector;
  LambdaInfo info;
  Vector right_slice;
  DataChunk input_chunk;
  DataChunk even_result_chunk;
  DataChunk odd_result_chunk;
  unsigned_long local_368;
  bool local_359;
  DataChunk *local_358;
  ulong local_350;
  undefined1 local_348 [32];
  _Head_base<0UL,_duckdb::Vector_*,_false> local_328;
  _Head_base<0UL,_duckdb::ExpressionExecutor_*,_false> local_320;
  vector<duckdb::LogicalType,_true> local_318;
  idx_t local_300;
  SelectionVector local_2f8;
  SelectionVector local_2e0;
  SelectionVector local_2c8;
  vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> local_2a8;
  undefined1 local_288 [8];
  element_type *apeStack_280 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  unsigned_long *local_218;
  ulong local_210;
  LambdaInfo local_208;
  Vector local_170;
  DataChunk local_108;
  DataChunk local_c8;
  LogicalType local_88;
  DataChunk local_70;
  
  local_359 = false;
  LambdaInfo::LambdaInfo(&local_208,args,state,result,&local_359);
  if (local_359 == false) {
    context = ExpressionState::GetContext(state);
    ReduceExecuteInfo::ReduceExecuteInfo((ReduceExecuteInfo *)local_348,&local_208,context);
    DataChunk::DataChunk(&local_70);
    pAVar4 = Allocator::DefaultAllocator();
    optional_ptr<duckdb::Expression,_true>::CheckValid(&local_208.lambda_expr);
    LogicalType::LogicalType((LogicalType *)&local_170,&(local_208.lambda_expr.ptr)->return_type);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_170;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_288,__l,
               (allocator_type *)&local_108);
    DataChunk::Initialize(&local_70,pAVar4,(vector<duckdb::LogicalType,_true> *)local_288,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_288);
    LogicalType::~LogicalType((LogicalType *)&local_170);
    DataChunk::DataChunk(&local_c8);
    pAVar4 = Allocator::DefaultAllocator();
    optional_ptr<duckdb::Expression,_true>::CheckValid(&local_208.lambda_expr);
    LogicalType::LogicalType((LogicalType *)&local_170,&(local_208.lambda_expr.ptr)->return_type);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_170;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_288,__l_00
               ,(allocator_type *)&local_108);
    DataChunk::Initialize(&local_c8,pAVar4,(vector<duckdb::LogicalType,_true> *)local_288,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_288);
    LogicalType::~LogicalType((LogicalType *)&local_170);
    uVar13 = 0;
    do {
      local_358 = &local_70;
      if ((uVar13 & 1) == 0) {
        local_358 = &local_c8;
      }
      local_368 = 0;
      uVar14 = local_300 + uVar13;
      local_218 = (unsigned_long *)local_348._0_8_;
      local_2c8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2c8.sel_vector = (sel_t *)0x0;
      local_2c8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_350 = uVar13;
      SelectionVector::Initialize(&local_2c8,local_208.row_count);
      bVar16 = true;
      if (local_208.row_count != 0) {
        uVar12 = 0;
        index = 0;
        index_00 = 0;
        lVar15 = 0;
        uVar13 = local_208.row_count;
        do {
          local_210 = uVar12;
          if (local_218[lVar15] == 0) {
            index = index + 0x40;
          }
          else if ((ulong)(lVar15 << 6) < uVar13) {
            do {
              if (((unsigned_long *)local_348._0_8_ == (unsigned_long *)0x0) ||
                 ((*(ulong *)(local_348._0_8_ + (index >> 6) * 8) >> (index & 0x3f) & 1) != 0)) {
                uVar13 = index;
                if ((local_208.list_column_format.sel)->sel_vector != (sel_t *)0x0) {
                  uVar13 = (ulong)(local_208.list_column_format.sel)->sel_vector[index];
                }
                if (uVar14 < local_208.list_entries[uVar13].length) {
                  local_2c8.sel_vector[local_368] =
                       (int)local_208.list_entries[uVar13].offset + (int)uVar14;
                  local_2f8.sel_vector[local_368] = (sel_t)index_00;
                  local_2e0.sel_vector[local_368] = (sel_t)index;
                  local_368 = local_368 + 1;
                }
                else {
                  if ((uVar14 == 0 & local_208.has_initial &
                      local_208.list_entries[uVar13].length == 0) == 1) {
                    if ((unsigned_long *)local_348._0_8_ == (unsigned_long *)0x0) {
                      local_170._0_8_ = local_348._24_8_;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)local_288,(unsigned_long *)&local_170);
                      peVar3 = apeStack_280[0];
                      local_348._8_8_ = local_288;
                      uVar2 = local_348._16_8_;
                      local_288 = (undefined1  [8])0x0;
                      apeStack_280[0] = (element_type *)0x0;
                      local_348._16_8_ = peVar3;
                      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2),
                         apeStack_280[0] != (element_type *)0x0)) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_280[0]);
                      }
                      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                               operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                           *)(local_348 + 8));
                      local_348._0_8_ =
                           (pTVar5->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>;
                    }
                    bVar1 = (byte)index & 0x3f;
                    *(ulong *)(local_348._0_8_ + (index >> 6) * 8) =
                         *(ulong *)(local_348._0_8_ + (index >> 6) * 8) &
                         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
                    pvVar9 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                                       (&local_208.column_infos,0);
                    Vector::GetValue((Value *)local_288,(pvVar9->vector)._M_data,index);
                    Vector::SetValue(local_208.result,index,(Value *)local_288);
                  }
                  else {
                    if ((unsigned_long *)local_348._0_8_ == (unsigned_long *)0x0) {
                      local_170._0_8_ = local_348._24_8_;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)local_288,(unsigned_long *)&local_170);
                      peVar3 = apeStack_280[0];
                      local_348._8_8_ = local_288;
                      uVar2 = local_348._16_8_;
                      local_288 = (undefined1  [8])0x0;
                      apeStack_280[0] = (element_type *)0x0;
                      local_348._16_8_ = peVar3;
                      if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2),
                         apeStack_280[0] != (element_type *)0x0)) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_280[0]);
                      }
                      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                               operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                           *)(local_348 + 8));
                      local_348._0_8_ =
                           (pTVar5->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>;
                    }
                    bVar1 = (byte)index & 0x3f;
                    *(ulong *)(local_348._0_8_ + (index >> 6) * 8) =
                         *(ulong *)(local_348._0_8_ + (index >> 6) * 8) &
                         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
                    pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                             operator->((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                                         *)&local_328);
                    Vector::GetValue((Value *)local_288,pVVar6,index_00);
                    Vector::SetValue(local_208.result,index,(Value *)local_288);
                  }
                  Value::~Value((Value *)local_288);
                }
                index_00 = index_00 + 1;
                uVar13 = local_208.row_count;
              }
              index = index + 1;
              uVar12 = uVar12 + 1;
            } while (uVar12 < uVar13);
          }
          lVar15 = lVar15 + 1;
          uVar12 = local_210 + 0x40;
        } while (index < uVar13);
        bVar16 = true;
        if (local_368 != 0) {
          Value::BIGINT((Value *)&local_170,uVar14 + 1);
          Vector::Vector((Vector *)local_288,(Value *)&local_170);
          Value::~Value((Value *)&local_170);
          pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                             ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                               *)&local_328);
          pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                             ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                               *)&local_328);
          Vector::Slice(pVVar6,pVVar7,&local_2f8,local_368);
          optional_ptr<duckdb::Vector,_true>::CheckValid(&local_208.child_vector);
          Vector::Vector(&local_170,local_208.child_vector.ptr,&local_2c8,local_368);
          DataChunk::DataChunk(&local_108);
          DataChunk::InitializeEmpty(&local_108,&local_318);
          local_108.count = local_368;
          uVar13 = (ulong)local_208.has_index;
          if (uVar13 == 1) {
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_108.data,0);
            Vector::Reference(pvVar8,(Vector *)local_288);
          }
          if ((local_350 == 0) && (local_208.has_initial == true)) {
            pvVar9 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                               (&local_208.column_infos,0);
            Vector::Slice((pvVar9->vector)._M_data,&local_2e0,local_368);
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_108.data,uVar13 + 1);
            pvVar9 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                               (&local_208.column_infos,0);
            pVVar10 = (pvVar9->vector)._M_data;
          }
          else {
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_108.data,uVar13 + 1);
            pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                                 *)&local_328);
          }
          Vector::Reference(pvVar8,pVVar10);
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_108.data,uVar13);
          Vector::Reference(pvVar8,&local_170);
          local_2a8.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar14 = (ulong)local_208.has_initial;
          if (((long)local_208.column_infos.
                     super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                     .
                     super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_208.column_infos.
                     super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                     .
                     super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 - uVar14
              != 0) {
            __n = 0;
            do {
              pvVar9 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                                 (&local_208.column_infos,__n);
              if (((pvVar9->vector)._M_data)->vector_type == CONSTANT_VECTOR) {
                pvVar8 = vector<duckdb::Vector,_true>::operator[]
                                   (&local_108.data,(uVar13 | 2) + __n);
                pvVar9 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                                   (&local_208.column_infos,uVar14 + __n);
                pVVar10 = (pvVar9->vector)._M_data;
              }
              else {
                pvVar9 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                                   (&local_208.column_infos,uVar14 + __n);
                ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
                emplace_back<std::reference_wrapper<duckdb::Vector>&,duckdb::SelectionVector&,unsigned_long&>
                          ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&local_2a8,
                           &pvVar9->vector,&local_2e0,&local_368);
                pvVar8 = vector<duckdb::Vector,_true>::operator[]
                                   (&local_108.data,(uVar13 | 2) + __n);
                pVVar10 = vector<duckdb::Vector,_true>::back
                                    ((vector<duckdb::Vector,_true> *)&local_2a8);
              }
              Vector::Reference(pvVar8,pVVar10);
              __n = __n + 1;
            } while (__n < ((long)local_208.column_infos.
                                  super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  .
                                  super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_208.column_infos.
                                  super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  .
                                  super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           0x4ec4ec4ec4ec4ec5 - uVar14);
          }
          DataChunk::Reset(local_358);
          pDVar11 = &local_70;
          if ((local_350 & 1) == 0) {
            pDVar11 = &local_c8;
          }
          pDVar11->count = local_368;
          this = unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
                 ::operator->((unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
                               *)&local_320);
          ExpressionExecutor::Execute(this,&local_108,local_358);
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_358->data,0);
          this_00.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
          super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
               operator_new(0x68);
          LogicalType::LogicalType(&local_88,&pvVar8->type);
          Vector::Vector((Vector *)
                         this_00.
                         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
                         .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl,&local_88,
                         local_368);
          LogicalType::~LogicalType(&local_88);
          __ptr._M_head_impl = local_328._M_head_impl;
          bVar16 = (tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
                   local_328._M_head_impl != (_Head_base<0UL,_duckdb::Vector_*,_false>)0x0;
          local_328._M_head_impl =
               (Vector *)
               this_00.
               super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
               super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
          if (bVar16) {
            ::std::default_delete<duckdb::Vector>::operator()
                      ((default_delete<duckdb::Vector> *)&local_328,__ptr._M_head_impl);
          }
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_358->data,0);
          pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                             ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                               *)&local_328);
          VectorOperations::Copy(pvVar8,pVVar7,local_368,0,0);
          ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::~vector(&local_2a8);
          DataChunk::~DataChunk(&local_108);
          if (local_170.auxiliary.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_170.auxiliary.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_170.buffer.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_170.buffer.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          LogicalType::~LogicalType(&local_170.type);
          if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
          }
          if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_pi);
          }
          if (local_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250._M_pi);
          }
          LogicalType::~LogicalType((LogicalType *)apeStack_280);
          bVar16 = false;
        }
      }
      if (local_2c8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2c8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      uVar13 = local_350;
      pDVar11 = &local_c8;
      if ((local_350 & 1) == 0) {
        pDVar11 = &local_70;
      }
      DataChunk::Reset(pDVar11);
      uVar13 = uVar13 + 1;
    } while (!bVar16);
    if ((local_208.is_all_constant == true) && (local_208.is_volatile == false)) {
      Vector::SetVectorType(local_208.result,CONSTANT_VECTOR);
    }
    DataChunk::~DataChunk(&local_c8);
    DataChunk::~DataChunk(&local_70);
    if (local_2e0.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2e0.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2f8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2f8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_318);
    if ((_Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
         )local_320._M_head_impl != (ExpressionExecutor *)0x0) {
      ::std::default_delete<duckdb::ExpressionExecutor>::operator()
                ((default_delete<duckdb::ExpressionExecutor> *)&local_320,local_320._M_head_impl);
    }
    local_320._M_head_impl = (ExpressionExecutor *)0x0;
    if (local_328._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_328,local_328._M_head_impl);
    }
    local_328._M_head_impl = (Vector *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._16_8_);
    }
  }
  ::std::
  vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
  ::~vector(&local_208.column_infos.
             super_vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
           );
  if (local_208.list_column_format.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.list_column_format.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_208.list_column_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_data
      .internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.list_column_format.validity.super_TemplatedValidityMask<unsigned_long>.
               validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void LambdaFunctions::ListReduceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// Initializes the left slice from the list entries, active rows, the expression executor and the input types
	bool completed = false;
	LambdaInfo info(args, state, result, completed);
	if (completed) {
		return;
	}

	ReduceExecuteInfo execute_info(info, state.GetContext());

	// Since the left slice references the result chunk, we need to create two result chunks.
	// This means there is always an empty result chunk for the next iteration,
	// without the referenced chunk having to be reset until the current iteration is complete.
	DataChunk odd_result_chunk;
	odd_result_chunk.Initialize(Allocator::DefaultAllocator(), {info.lambda_expr->return_type});

	DataChunk even_result_chunk;
	even_result_chunk.Initialize(Allocator::DefaultAllocator(), {info.lambda_expr->return_type});

	// Execute reduce until all rows are finished.
	idx_t loops = 0;
	bool end = false;
	while (!end) {
		auto &result_chunk = loops % 2 ? odd_result_chunk : even_result_chunk;
		auto &spare_result_chunk = loops % 2 ? even_result_chunk : odd_result_chunk;

		end = ExecuteReduce(loops, execute_info, info, result_chunk);
		spare_result_chunk.Reset();
		loops++;
	}

	if (info.is_all_constant && !info.is_volatile) {
		info.result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}